

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_decode.c
# Opt level: O1

int cram_get_bam_seq(cram_fd *fd,bam_seq_t **bam)

{
  uint uVar1;
  SAM_hdr *pSVar2;
  cram_slice *pcVar3;
  char *__s;
  bam_seq_t *pbVar4;
  ulong uVar5;
  int iVar6;
  cram_record *pcVar7;
  int iVar8;
  long lVar9;
  uchar *puVar10;
  uchar *puVar11;
  size_t sVar12;
  uint8_t *puVar13;
  uint8_t *puVar14;
  uint8_t *__dest;
  int iVar15;
  char *qname;
  uchar local_438 [1032];
  
  pcVar7 = cram_get_seq(fd);
  if (pcVar7 == (cram_record *)0x0) {
    iVar15 = -1;
  }
  else {
    pSVar2 = fd->header;
    pcVar3 = fd->ctr->slice;
    if ((fd->required_fields & 1) == 0) {
      qname = "?";
      iVar6 = 1;
    }
    else {
      iVar6 = pcVar7->name_len;
      if (iVar6 == 0) {
        iVar15 = fd->ctr->curr_rec;
        __s = fd->prefix;
        sVar12 = strlen(__s);
        sVar12 = (size_t)(int)sVar12;
        qname = (char *)local_438;
        memcpy(qname,__s,sVar12);
        local_438[sVar12] = ':';
        uVar1 = pcVar7->mate_line;
        lVar9 = (ulong)uVar1 + 1;
        if (iVar15 + -1 <= (int)uVar1) {
          lVar9 = (long)iVar15;
        }
        if ((int)uVar1 < 0) {
          lVar9 = (long)iVar15;
        }
        puVar10 = append_uint64(local_438 + sVar12 + 1,lVar9 + pcVar3->hdr->record_counter);
        iVar6 = (int)puVar10 - (int)qname;
      }
      else {
        qname = (char *)(pcVar3->name_blk->data + pcVar7->name);
      }
    }
    iVar8 = pcVar7->rg;
    iVar15 = -1;
    if ((-2 < (long)iVar8) && (iVar8 < pSVar2->nrg)) {
      if (iVar8 == -1) {
        iVar8 = 0;
      }
      else {
        iVar8 = pSVar2->rg[iVar8].name_len + 4;
      }
      uVar1 = fd->required_fields;
      if ((uVar1 & 0x600) == 0) {
        pcVar7->len = 1;
        puVar10 = "*";
      }
      else {
        puVar10 = pcVar3->seqs_blk->data;
        if (puVar10 == (uchar *)0x0) {
          return -1;
        }
        puVar10 = puVar10 + pcVar7->seq;
      }
      if ((uVar1 >> 10 & 1) == 0) {
        puVar11 = (uchar *)0x0;
      }
      else {
        puVar11 = pcVar3->qual_blk->data;
        if (puVar11 == (uchar *)0x0) {
          return -1;
        }
        puVar11 = puVar11 + pcVar7->qual;
      }
      iVar6 = bam_construct_seq(bam,(long)iVar8 + (long)pcVar7->aux_size,qname,(long)iVar6,
                                pcVar7->flags,pcVar7->ref_id,pcVar7->apos,pcVar7->aend,pcVar7->mqual
                                ,pcVar7->ncigar,pcVar3->cigar + pcVar7->cigar,pcVar7->mate_ref_id,
                                pcVar7->mate_pos,pcVar7->tlen,pcVar7->len,(char *)puVar10,
                                (char *)puVar11);
      if (iVar6 != -1) {
        pbVar4 = *bam;
        uVar5 = *(ulong *)&(pbVar4->core).field_0x8;
        iVar15 = (pbVar4->core).l_qseq;
        __dest = pbVar4->data +
                 (long)(iVar15 + 1 >> 1) + (uVar5 >> 0x18 & 0xff) + (long)iVar15 +
                 (uVar5 >> 0x30) * 4;
        puVar13 = __dest;
        if ((long)pcVar7->aux_size != 0) {
          memcpy(__dest,pcVar3->aux_blk->data + pcVar7->aux,(long)pcVar7->aux_size);
          puVar13 = __dest + pcVar7->aux_size;
        }
        puVar14 = puVar13;
        if ((long)pcVar7->rg != -1) {
          sVar12 = (size_t)pSVar2->rg[pcVar7->rg].name_len;
          puVar13[0] = 'R';
          puVar13[1] = 'G';
          puVar13[2] = 'Z';
          memcpy(puVar13 + 3,pSVar2->rg[pcVar7->rg].name,sVar12);
          puVar14 = puVar13 + sVar12 + 4;
          puVar13[sVar12 + 3] = '\0';
        }
        iVar15 = iVar6 + ((int)puVar14 - (int)__dest);
      }
    }
  }
  return iVar15;
}

Assistant:

int cram_get_bam_seq(cram_fd *fd, bam_seq_t **bam) {
    cram_record *cr;
    cram_container *c;
    cram_slice *s;

    if (!(cr = cram_get_seq(fd)))
	return -1;

    c = fd->ctr;
    s = c->slice;

    return cram_to_bam(fd->header, fd, s, cr, c->curr_rec-1, bam);
}